

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkScrew.cpp
# Opt level: O1

void __thiscall chrono::ChLinkScrew::ArchiveOUT(ChLinkScrew *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChLinkScrew>(marchive);
  ChLinkLock::ArchiveOUT(&this->super_ChLinkLock,marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  return;
}

Assistant:

void ChLinkScrew::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkScrew>();

    // serialize parent class
    ChLinkLock::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(tau);
}